

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

HME * __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::atomic_get_entry(HME *__return_storage_ptr__,
                  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                  *this,size_type slot)

{
  uint uVar1;
  long lVar2;
  BCL *this_00;
  uint uVar3;
  atomic_op<int> *in_R8;
  GlobalPtr<int> GVar4;
  GlobalPtr<int> ptr;
  GlobalPtr<int> ptr_00;
  GlobalPtr<int> ptr_01;
  uint local_54;
  size_t local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_38 [2];
  
  lVar2 = lrand48();
  GVar4 = slot_used_ptr(this,slot);
  local_50 = GVar4.ptr;
  this_00 = (BCL *)GVar4.rank;
  uVar3 = 1 << ((char)(lVar2 % 0x1e) + 2U & 0x1f);
  local_48 = 0x10eb28;
  local_40 = 0x10eb60;
  local_38[0] = 0x10eb98;
  local_38[1] = 0;
  GVar4.ptr = (size_t)&local_54;
  GVar4.rank = local_50;
  local_54 = uVar3;
  uVar1 = fetch_and_op<int>(this_00,GVar4,local_38,in_R8);
  if (((uVar1 & 2) == 0) || ((uVar1 & uVar3) != 0)) {
    if ((uVar1 & 3) == 0) {
      if ((uVar1 & uVar3) == 0) {
        local_54 = ~uVar3;
        local_48 = 0x10ec40;
        local_40 = 0x10ec78;
        local_38[0] = 0x10ecb0;
        local_38[1] = 0;
        ptr_01.ptr = (size_t)&local_54;
        ptr_01.rank = local_50;
        fetch_and_op<int>(this_00,ptr_01,local_38,in_R8);
      }
      (__return_storage_ptr__->key).len = 0;
      __return_storage_ptr__->val = 0;
      __return_storage_ptr__->used = 0;
      (__return_storage_ptr__->key).ptr.rank = 0;
      (__return_storage_ptr__->key).ptr.ptr = 0;
    }
    else {
      if ((uVar1 & uVar3) == 0) {
        local_54 = ~uVar3;
        local_48 = 0x10ec40;
        local_40 = 0x10ec78;
        local_38[0] = 0x10ecb0;
        local_38[1] = 0;
        ptr_00.ptr = (size_t)&local_54;
        ptr_00.rank = local_50;
        fetch_and_op<int>(this_00,ptr_00,local_38,in_R8);
      }
      atomic_get_entry(__return_storage_ptr__,this,slot);
    }
  }
  else {
    get_entry(__return_storage_ptr__,this,slot);
    local_54 = ~uVar3;
    local_48 = 0x10ec40;
    local_40 = 0x10ec78;
    local_38[0] = 0x10ecb0;
    local_38[1] = 0;
    ptr.ptr = (size_t)&local_54;
    ptr.rank = local_50;
    fetch_and_op<int>(this_00,ptr,local_38,in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

HME atomic_get_entry(size_type slot) {
    int old_value = ready_flag;

    // Bits 2 -> 32 are for readers to mark reserved
    int read_bit = 2 + (lrand48() % 30);

    auto ptr = slot_used_ptr(slot);

    int return_value = BCL::fetch_and_op<int>(ptr, (0x1 << read_bit), BCL::or_<int>{});

    if (return_value & ready_flag && !(return_value & (0x1 << read_bit))) {
      auto entry = get_entry(slot);
      int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      return entry;
    } else if ((return_value & (0x3)) == 0) {
      if (!(return_value & (0x1 << read_bit))) {
        int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      }
      return HME{};
    } else {
      // OPTIMIZE: use return value to pick a reader bit "hint"
      //           unclear if this will help, since reader bits
      //           will only ever be flipped for around 4-6us.
      if (!(return_value & (0x1 << read_bit))) {
        int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      }
      return atomic_get_entry(slot);
    }
  }